

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O3

wchar_t archive_acl_from_text_nl
                  (archive_acl *acl,char *text,size_t length,wchar_t want_type,
                  archive_string_conv *sc)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  archive_acl_entry *paVar10;
  int *piVar11;
  ulong uVar12;
  byte *pbVar13;
  byte *pbVar14;
  long lVar15;
  uint uVar16;
  byte *pbVar17;
  byte bVar18;
  ulong uVar19;
  ulong uVar20;
  anon_struct_16_2_267fbce2 field [6];
  wchar_t local_ec;
  wchar_t local_e8;
  wchar_t local_e4;
  wchar_t local_e0;
  wchar_t local_dc;
  undefined8 local_d8;
  uint local_cc;
  byte *local_c8;
  byte *local_c0;
  ulong local_b8;
  archive_acl *local_b0;
  archive_string_conv *local_a8;
  long local_a0;
  long *local_98;
  long local_90;
  byte *local_88 [5];
  long alStack_60 [6];
  
  local_cc = 5;
  if (want_type < L'̀') {
    if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
      return L'\xffffffe2';
    }
  }
  else if (want_type == L'㰀') {
    local_cc = 6;
  }
  else {
    if (want_type != L'̀') {
      return L'\xffffffe2';
    }
    want_type = L'Ā';
  }
  wVar4 = L'\0';
  local_b8 = 0;
  local_b0 = acl;
  local_a8 = sc;
  if (length == 0 || text == (char *)0x0) {
LAB_0016622f:
    archive_acl_reset(local_b0,(wchar_t)local_b8);
    return wVar4;
  }
  uVar20 = (ulong)local_cc;
  local_a0 = uVar20 + 0xfffffffe;
  local_b8 = 0;
  wVar4 = L'\0';
LAB_00165822:
  if (*text != 0) {
    uVar12 = 0;
    pbVar8 = (byte *)text;
LAB_00165832:
    uVar7 = uVar12;
    pbVar9 = pbVar8;
    pbVar13 = pbVar8;
    pbVar14 = pbVar8;
    if (length != 0) {
      pbVar14 = pbVar8 + length;
      do {
        uVar12 = (ulong)*pbVar8;
        pbVar13 = pbVar14;
        if ((0x20 < uVar12) || ((0x100000600U >> (uVar12 & 0x3f) & 1) == 0)) {
          lVar15 = 0;
          goto LAB_001658b9;
        }
        pbVar8 = pbVar8 + 1;
        length = length - 1;
        pbVar9 = pbVar14;
      } while (length != 0);
    }
    goto LAB_00165866;
  }
  goto LAB_0016622f;
LAB_001658b9:
  pbVar9 = pbVar8;
  if (((byte)uVar12 < 0x3b) && ((0x400100900000600U >> (uVar12 & 0x3f) & 1) != 0)) {
    pbVar13 = pbVar8 + lVar15;
    uVar19 = length - lVar15;
    pbVar17 = pbVar13;
    goto LAB_001658e5;
  }
  if (length - 1 == lVar15) goto LAB_00165866;
  uVar12 = (ulong)pbVar8[lVar15 + 1];
  lVar15 = lVar15 + 1;
  goto LAB_001658b9;
  while( true ) {
    pbVar17 = pbVar17 + 1;
    uVar19 = uVar19 - 1;
    if (uVar19 == 0) break;
LAB_001658e5:
    bVar18 = *pbVar17;
    if (bVar18 < 0x2c) {
      if (bVar18 == 10) goto LAB_00165872;
      if (bVar18 == 0x23) {
        uVar12 = 0;
        goto LAB_0016592b;
      }
    }
    else if ((bVar18 == 0x2c) || (bVar18 == 0x3a)) goto LAB_00165872;
  }
  goto LAB_00165866;
  while (uVar12 = uVar12 + 1, pbVar14 = pbVar17 + uVar19, uVar19 != uVar12) {
LAB_0016592b:
    bVar18 = pbVar17[uVar12];
    if ((bVar18 == 10) || (bVar18 == 0x2c)) {
      pbVar17 = pbVar17 + uVar12;
      uVar19 = uVar19 - uVar12;
      goto LAB_00165872;
    }
  }
LAB_00165866:
  pbVar17 = pbVar14;
  bVar18 = *pbVar17;
  uVar19 = 0;
  pbVar8 = pbVar9;
LAB_00165872:
  text = (char *)(pbVar17 + (uVar19 != 0));
  length = 0;
  if (uVar19 != 0) {
    length = uVar19 - 1;
  }
  if (uVar7 < uVar20) {
    (&local_98)[uVar7 * 2] = (long *)pbVar8;
    (&local_90)[uVar7 * 2] = (long)pbVar13;
  }
  uVar12 = uVar7 + 1;
  pbVar8 = (byte *)text;
  if (bVar18 != 0x3a) goto LAB_0016595c;
  goto LAB_00165832;
LAB_0016595c:
  uVar16 = (uint)uVar7;
  local_dc = wVar4;
  if ((uint)(uVar7 + 1) < local_cc) {
    memset(local_88 + uVar7 * 2,0,(ulong)((int)local_a0 - uVar16) * 0x10 + 0x10);
  }
  if ((local_98 != (long *)0x0) && (wVar4 = local_dc, (char)*local_98 == '#'))
  goto switchD_001659e8_caseD_7;
  uVar12 = local_90 - (long)local_98;
  local_e4 = L'\0';
  if (want_type != L'㰀') {
    local_d8 = 0;
    local_ec = want_type;
    if ((char)*local_98 == 'd') {
      if (uVar12 == 1) {
LAB_00165a17:
        local_ec = L'Ȁ';
        local_d8 = 1;
      }
      else if ((6 < uVar12) &&
              (*(short *)((long)local_98 + 5) == 0x746c &&
               *(int *)((long)local_98 + 1) == 0x75616665)) {
        if (uVar12 == 7) goto LAB_00165a17;
        local_ec = L'Ȁ';
        local_98 = (long *)((long)local_98 + 7);
      }
    }
    iVar3 = (int)local_d8;
    uVar12 = (ulong)((iVar3 + 1U) * 0x10);
    pbVar8 = *(byte **)((long)&local_98 + uVar12);
    pbVar14 = *(byte **)((long)&local_90 + uVar12);
    if (pbVar8 < pbVar14) {
      local_e0 = L'\0';
      pbVar13 = pbVar8;
      do {
        bVar18 = *pbVar13;
        if ((byte)(bVar18 - 0x3a) < 0xf6) goto LAB_00165ab7;
        wVar4 = L'\x7fffffff';
        if ((local_e0 < L'\x0ccccccd') && ((local_e0 != L'\x0ccccccc' || (bVar18 < 0x38)))) {
          wVar4 = (uint)bVar18 + local_e0 * 10 + L'\xffffffd0';
        }
        local_e0 = wVar4;
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != pbVar14);
      if (local_e0 == L'\xffffffff') goto LAB_00165ab7;
    }
    else {
LAB_00165ab7:
      if (iVar3 + 3U <= uVar16) {
        uVar12 = (ulong)((iVar3 + 3U) * 0x10);
        pbVar13 = *(byte **)((long)&local_98 + uVar12);
        pbVar9 = *(byte **)((long)&local_90 + uVar12);
        if (pbVar13 < pbVar9) {
          local_e0 = L'\0';
          do {
            bVar18 = *pbVar13;
            if ((byte)(bVar18 - 0x3a) < 0xf6) goto LAB_00165b17;
            wVar4 = L'\x7fffffff';
            if ((local_e0 < L'\x0ccccccd') && ((local_e0 != L'\x0ccccccc' || (bVar18 < 0x38)))) {
              wVar4 = (uint)bVar18 + local_e0 * 10 + L'\xffffffd0';
            }
            local_e0 = wVar4;
            pbVar13 = pbVar13 + 1;
          } while (pbVar13 != pbVar9);
          goto LAB_00165b1d;
        }
      }
LAB_00165b17:
      local_e0 = L'\xffffffff';
    }
LAB_00165b1d:
    pcVar1 = *(char **)((long)&local_98 + (ulong)(uint)(iVar3 << 4));
    pcVar2 = *(char **)((long)&local_90 + (ulong)(uint)(iVar3 << 4));
    lVar15 = (long)pcVar2 - (long)pcVar1;
    if (pcVar2 == pcVar1) goto switchD_00165b60_caseD_1;
    switch((int)*pcVar1 - 0x67U >> 1 | (uint)(((int)*pcVar1 - 0x67U & 1) != 0) << 0x1f) {
    case 0:
      local_e8 = L'✓';
      wVar4 = L'✔';
      if ((lVar15 != 1) && ((lVar15 != 5 || (wVar4 = L'✔', *(int *)(pcVar1 + 1) != 0x70756f72))))
      {
LAB_00165d6e:
        wVar4 = L'\xffffffec';
        goto switchD_001659e8_caseD_7;
      }
      break;
    default:
      goto switchD_00165b60_caseD_1;
    case 3:
      local_e8 = L'✕';
      if ((lVar15 != 1) && ((lVar15 != 4 || (pcVar1[3] != 'k' || *(short *)(pcVar1 + 1) != 0x7361)))
         ) goto switchD_00165b60_caseD_1;
LAB_00165cf8:
      if (iVar3 + 1U == uVar16) {
        if (pbVar8 < pbVar14) {
          wVar4 = ismode((char *)pbVar8,(char *)pbVar14,&local_e4);
          if (wVar4 == L'\0') {
            if ((int)local_d8 + 2U == uVar16) goto LAB_0016601a;
            goto LAB_00166104;
          }
          iVar3 = -1;
          pbVar14 = (byte *)0x0;
          pbVar8 = (byte *)0x0;
        }
        else {
          pbVar14 = (byte *)0x0;
          pbVar8 = (byte *)0x0;
          iVar3 = 0;
        }
      }
      else {
        if ((iVar3 + 2U == uVar16) && (pbVar8 < pbVar14)) goto switchD_00165b60_caseD_1;
LAB_00166104:
        pbVar14 = (byte *)0x0;
        pbVar8 = (byte *)0x0;
        iVar3 = 0;
      }
      goto LAB_0016610b;
    case 4:
      local_e8 = L'✖';
      if ((lVar15 == 1) || ((lVar15 == 5 && (*(int *)(pcVar1 + 1) == 0x72656874))))
      goto LAB_00165cf8;
      goto switchD_00165b60_caseD_1;
    case 7:
      local_e8 = L'✑';
      wVar4 = L'✒';
      if ((lVar15 != 1) &&
         ((lVar15 != 4 || (wVar4 = L'✒', pcVar1[3] != 'r' || *(short *)(pcVar1 + 1) != 0x6573))))
      goto LAB_00165d6e;
    }
    iVar3 = 0;
    if ((pbVar14 <= pbVar8) && (local_e0 == L'\xffffffff')) {
      pbVar14 = (byte *)0x0;
      pbVar8 = (byte *)0x0;
      local_e8 = wVar4;
    }
LAB_0016610b:
    local_c8 = pbVar14;
    local_c0 = pbVar8;
    if ((local_e4 == L'\0') &&
       (uVar12 = (ulong)((int)local_d8 + iVar3 + 2),
       wVar4 = ismode((char *)(&local_98)[uVar12 * 2],(char *)(&local_90)[uVar12 * 2],&local_e4),
       wVar4 == L'\0')) goto LAB_0016601a;
    goto LAB_00166158;
  }
  wVar4 = L'\xffffffec';
  switch(uVar12) {
  case 4:
    if ((int)*local_98 != 0x72657375) goto switchD_001659e8_caseD_7;
    local_e8 = L'✑';
    break;
  case 5:
    if (*(char *)((long)local_98 + 4) != 'p' || (int)*local_98 != 0x756f7267)
    goto switchD_001659e8_caseD_7;
    local_e8 = L'✓';
    break;
  case 6:
    if (*(short *)((long)local_98 + 4) == 0x4072 && (int)*local_98 == 0x656e776f) {
      local_e8 = L'✒';
    }
    else {
      if (*(short *)((long)local_98 + 4) != 0x4070 || (int)*local_98 != 0x756f7267)
      goto switchD_001659e8_caseD_7;
      local_e8 = L'✔';
    }
    goto LAB_00165da7;
  default:
    goto switchD_001659e8_caseD_7;
  case 9:
    if ((char)local_98[1] != '@' || *local_98 != 0x656e6f7972657665) goto switchD_001659e8_caseD_7;
    local_e8 = L'❻';
LAB_00165da7:
    local_c0 = (byte *)0x0;
    iVar3 = 0;
    pbVar8 = (byte *)0x0;
    wVar4 = L'\xffffffff';
    goto LAB_00165db2;
  }
  iVar3 = 1;
  local_c0 = local_88[0];
  pbVar8 = local_88[1];
  wVar4 = L'\xffffffff';
  if (local_88[0] < local_88[1]) {
    wVar6 = L'\0';
    pbVar14 = local_88[0];
    do {
      bVar18 = *pbVar14;
      wVar4 = L'\xffffffff';
      if ((byte)(bVar18 - 0x3a) < 0xf6) break;
      wVar4 = L'\x7fffffff';
      if ((wVar6 < L'\x0ccccccd') && ((wVar6 != L'\x0ccccccc' || (bVar18 < 0x38)))) {
        wVar4 = (uint)bVar18 + wVar6 * 10 + L'\xffffffd0';
      }
      wVar6 = wVar4;
      pbVar14 = pbVar14 + 1;
      wVar4 = wVar6;
    } while (pbVar14 != local_88[1]);
  }
LAB_00165db2:
  uVar12 = (ulong)(uint)(iVar3 << 4);
  pbVar14 = *(byte **)((long)local_88 + uVar12);
  pbVar13 = *(byte **)((long)local_88 + uVar12 + 8);
  local_e0 = wVar4;
  if (pbVar14 < pbVar13) {
    local_e4 = L'\0';
LAB_00165dd6:
    bVar18 = *pbVar14;
    if (bVar18 < 99) {
      if (bVar18 < 0x44) {
        if (bVar18 == 0x2d) goto LAB_00165eb2;
        if (bVar18 == 0x41) {
          uVar16 = 0x400;
          goto LAB_00165eb0;
        }
        if (bVar18 != 0x43) goto switchD_00165e23_caseD_71;
        uVar16 = 0x2000;
      }
      else if (bVar18 < 0x57) {
        if (bVar18 == 0x44) {
          uVar16 = 0x100;
          goto LAB_00165eb0;
        }
        if (bVar18 != 0x52) goto switchD_00165e23_caseD_71;
        uVar16 = 0x40;
      }
      else if (bVar18 == 0x57) {
        uVar16 = 0x80;
      }
      else {
        if (bVar18 != 0x61) goto switchD_00165e23_caseD_71;
        uVar16 = 0x200;
      }
    }
    else {
      switch(bVar18) {
      case 0x6f:
        uVar16 = 0x4000;
        break;
      case 0x70:
        uVar16 = 0x20;
        break;
      case 0x71:
      case 0x74:
      case 0x75:
      case 0x76:
        goto switchD_00165e23_caseD_71;
      case 0x72:
        uVar16 = 8;
        break;
      case 0x73:
        uVar16 = 0x8000;
        break;
      case 0x77:
        uVar16 = 0x10;
        break;
      case 0x78:
        uVar16 = 1;
        break;
      default:
        if (bVar18 == 99) {
          uVar16 = 0x1000;
        }
        else {
          if (bVar18 != 100) goto switchD_00165e23_caseD_71;
          uVar16 = 0x800;
        }
      }
    }
LAB_00165eb0:
    local_e4 = local_e4 | uVar16;
LAB_00165eb2:
    pbVar14 = pbVar14 + 1;
    if (pbVar14 == pbVar13) goto LAB_00165ec2;
    goto LAB_00165dd6;
  }
LAB_00165ec2:
  pbVar14 = *(byte **)((long)local_88 + uVar12 + 0x10);
  pbVar13 = *(byte **)((long)local_88 + uVar12 + 0x18);
  if (pbVar14 < pbVar13) {
LAB_00165edb:
    bVar18 = *pbVar14;
    if (bVar18 < 100) {
      if (bVar18 < 0x49) {
        if (bVar18 != 0x2d) {
          if (bVar18 == 0x46) {
            uVar16 = 0x40000000;
            goto LAB_00165f53;
          }
          goto switchD_00165e23_caseD_71;
        }
        goto LAB_00165f55;
      }
      if (bVar18 == 0x49) {
        uVar16 = 0x1000000;
        goto LAB_00165f53;
      }
      if (bVar18 != 0x53) goto switchD_00165e23_caseD_71;
      uVar16 = 0x20000000;
    }
    else if (bVar18 < 0x69) {
      if (bVar18 == 100) {
        uVar16 = 0x4000000;
      }
      else {
        uVar16 = 0x2000000;
        if (bVar18 != 0x66) goto switchD_00165e23_caseD_71;
      }
    }
    else if (bVar18 == 0x69) {
      uVar16 = 0x10000000;
    }
    else {
      if (bVar18 != 0x6e) goto switchD_00165e23_caseD_71;
      uVar16 = 0x8000000;
    }
LAB_00165f53:
    local_e4 = local_e4 | uVar16;
LAB_00165f55:
    pbVar14 = pbVar14 + 1;
    if (pbVar14 == pbVar13) goto LAB_00165f65;
    goto LAB_00165edb;
  }
LAB_00165f65:
  piVar11 = *(int **)((long)local_88 + uVar12 + 0x20);
  lVar15 = *(long *)((long)alStack_60 + uVar12) - (long)piVar11;
  if (lVar15 == 5) {
    if ((char)piVar11[1] == 'w' && *piVar11 == 0x6f6c6c61) {
      local_ec = L'Ѐ';
    }
    else if ((char)piVar11[1] == 't' && *piVar11 == 0x69647561) {
      local_ec = L'က';
    }
    else {
      if ((char)piVar11[1] != 'm' || *piVar11 != 0x72616c61) goto LAB_0016601a;
      local_ec = L'\x2000';
    }
  }
  else {
    if ((lVar15 != 4) || (*piVar11 != 0x796e6564)) {
LAB_0016601a:
      wVar4 = L'\xffffffec';
      goto switchD_001659e8_caseD_7;
    }
    local_ec = L'ࠀ';
  }
  pbVar14 = *(byte **)((long)alStack_60 + uVar12 + 8);
  pbVar13 = *(byte **)((long)alStack_60 + uVar12 + 0x10);
  local_c8 = pbVar8;
  if (pbVar14 < pbVar13) {
    wVar6 = L'\0';
    do {
      bVar18 = *pbVar14;
      local_e0 = wVar4;
      if ((byte)(bVar18 - 0x3a) < 0xf6) break;
      wVar5 = L'\x7fffffff';
      if ((wVar6 < L'\x0ccccccd') && ((wVar6 != L'\x0ccccccc' || (bVar18 < 0x38)))) {
        wVar5 = (uint)bVar18 + wVar6 * 10 + L'\xffffffd0';
      }
      wVar6 = wVar5;
      pbVar14 = pbVar14 + 1;
      local_e0 = wVar6;
    } while (pbVar14 != pbVar13);
  }
LAB_00166158:
  wVar6 = local_e4;
  wVar5 = acl_special(local_b0,local_ec,local_e4,local_e8);
  wVar4 = local_dc;
  if (wVar5 != L'\0') {
    paVar10 = acl_new_entry(local_b0,local_ec,wVar6,local_e8,local_e0);
    if (paVar10 == (archive_acl_entry *)0x0) {
      return L'\xffffffe7';
    }
    if (((local_c0 == (byte *)0x0) || (local_c8 == local_c0)) || (*local_c0 == 0)) {
      archive_mstring_clean(&paVar10->name);
      wVar4 = local_dc;
    }
    else {
      wVar6 = archive_mstring_copy_mbs_len_l
                        (&paVar10->name,(char *)local_c0,(long)local_c8 - (long)local_c0,local_a8);
      wVar4 = local_dc;
      if (wVar6 != L'\0') {
        piVar11 = __errno_location();
        wVar4 = L'\xffffffec';
        if (*piVar11 == 0xc) {
          return L'\xffffffe2';
        }
      }
    }
  }
  local_b8 = (ulong)(uint)((uint)local_b8 | local_ec);
switchD_001659e8_caseD_7:
  if (uVar19 < 2) goto LAB_0016622f;
  goto LAB_00165822;
switchD_00165b60_caseD_1:
  goto LAB_0016601a;
switchD_00165e23_caseD_71:
  goto LAB_0016601a;
}

Assistant:

int
archive_acl_from_text_nl(struct archive_acl *acl, const char *text,
    size_t length, int want_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[6], name;

	const char *s, *st;
	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	char sep;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	ret = ARCHIVE_OK;
	types = 0;

	while (text != NULL && length > 0 && *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &length, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == '#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == 'd' && (len == 1 || (len >= 7
			    && memcmp((s + 1), "efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > (n + 3))
				isint(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			if (len == 0) {
				ret = ARCHIVE_WARN;
				continue;
			}

			switch (*s) {
			case 'u':
				if (len == 1 || (len == 4
				    && memcmp(st, "ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case 'g':
				if (len == 1 || (len == 5
				    && memcmp(st, "roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 'o':
				if (len == 1 || (len == 5
				    && memcmp(st, "ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case 'm':
				if (len == 1 || (len == 4
				    && memcmp(st, "ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 3
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (memcmp(s, "user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (memcmp(s, "group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (memcmp(s, "owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (memcmp(s, "group@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (memcmp(s, "everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
				break;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (memcmp(s, "deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (memcmp(s, "allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (memcmp(s, "audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (memcmp(s, "alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint(field[4 + n].start, field[4 + n].end,
			    &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}